

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void slang::ast::ModportSymbol::fromSyntax
               (ASTContext *context,ModportDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::ModportSymbol_*> *results)

{
  SyntaxKind SVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_03;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_04;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_05;
  bool bVar2;
  ArgumentDirection AVar3;
  ModportItemSyntax *node;
  ModportSymbol *this;
  MemberSyntax *this_00;
  ModportSimplePortListSyntax *pMVar4;
  SyntaxNode *this_01;
  ModportSubroutinePortListSyntax *pMVar5;
  ASTContext *in_RDI;
  const_iterator cVar6;
  const_iterator cVar7;
  ModportClockingSymbol *mcs;
  ModportClockingPortSyntax *clockingPort;
  MethodPrototypeSymbol *mps_1;
  MethodPrototypeSymbol *mps;
  ModportPortSyntax *subPort;
  iterator __end5_1;
  iterator __begin5_1;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *__range5_1;
  bool isExport;
  ModportSubroutinePortListSyntax *portList_1;
  ModportPortSymbol *mpp_1;
  ModportPortSymbol *mpp;
  ModportPortSyntax *simplePort;
  iterator __end5;
  iterator __begin5;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *__range5;
  ArgumentDirection direction;
  ModportSimplePortListSyntax *portList;
  MemberSyntax *port;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *__range3;
  ModportSymbol *modport;
  ModportItemSyntax *item;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *__range2;
  Compilation *comp;
  SyntaxNode *in_stack_00000408;
  Scope *in_stack_00000410;
  ModportClockingSymbol *in_stack_fffffffffffffda8;
  Scope *in_stack_fffffffffffffdb0;
  Scope *in_stack_fffffffffffffdb8;
  MethodPrototypeSymbol *in_stack_fffffffffffffdc0;
  SourceLocation *in_stack_fffffffffffffdc8;
  ASTContext *in_stack_fffffffffffffdd0;
  Compilation *in_stack_fffffffffffffdd8;
  Symbol *in_stack_fffffffffffffde0;
  ASTContext *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  ArgumentDirection in_stack_fffffffffffffdf4;
  ModportPortSymbol *in_stack_fffffffffffffdf8;
  ModportNamedPortSyntax *in_stack_fffffffffffffe00;
  ASTContext *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  undefined4 in_stack_fffffffffffffe90;
  ArgumentDirection in_stack_fffffffffffffe94;
  Compilation *in_stack_fffffffffffffe98;
  ASTContext *in_stack_fffffffffffffea0;
  
  ASTContext::getCompilation((ASTContext *)0x3e120c);
  cVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::begin
                    ((SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)0x3e1235);
  cVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::end
                    ((SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)0x3e1252);
  while (bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>_>
                           ((self_type *)in_stack_fffffffffffffdb0,
                            (iterator_base<const_slang::syntax::ModportItemSyntax_*> *)
                            in_stack_fffffffffffffda8), ((bVar2 ^ 0xffU) & 1) != 0) {
    node = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_false>
           ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_false>
                        *)0x3e128f);
    parsing::Token::valueText((Token *)in_stack_fffffffffffffdc0);
    parsing::Token::location(&node->name);
    this = BumpAllocator::
           emplace<slang::ast::ModportSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     ((BumpAllocator *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                      (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdd0,
                      in_stack_fffffffffffffdc8);
    Symbol::setSyntax(&this->super_Symbol,&node->super_SyntaxNode);
    not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x3e1350);
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffffdc0,
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffdb8);
    syntax_00._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffdf0;
    syntax_00._M_ptr = (pointer)in_stack_fffffffffffffde8;
    syntax_00._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffdf4;
    Symbol::setAttributes(in_stack_fffffffffffffde0,(Scope *)in_stack_fffffffffffffdd8,syntax_00);
    SmallVectorBase<const_slang::ast::ModportSymbol_*>::push_back
              ((SmallVectorBase<const_slang::ast::ModportSymbol_*> *)in_stack_fffffffffffffdb0,
               (ModportSymbol **)in_stack_fffffffffffffda8);
    not_null<slang::syntax::AnsiPortListSyntax_*>::operator->
              ((not_null<slang::syntax::AnsiPortListSyntax_*> *)0x3e13bc);
    slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::begin
              ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)0x3e13d5);
    slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::end
              ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)in_stack_fffffffffffffdb0);
    while (bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>_>
                             ((self_type *)in_stack_fffffffffffffdb0,
                              (iterator_base<slang::syntax::MemberSyntax_*> *)
                              in_stack_fffffffffffffda8), ((bVar2 ^ 0xffU) & 1) != 0) {
      this_00 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
                ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
                             *)0x3e142f);
      SVar1 = (this_00->super_SyntaxNode).kind;
      if (SVar1 == ModportClockingPort) {
        slang::syntax::SyntaxNode::as<slang::syntax::ModportClockingPortSyntax>
                  (&this_00->super_SyntaxNode);
        in_stack_fffffffffffffda8 =
             ModportClockingSymbol::fromSyntax
                       (in_stack_fffffffffffffea0,
                        (ModportClockingPortSyntax *)in_stack_fffffffffffffe98);
        in_stack_fffffffffffffdb0 = &this->super_Scope;
        std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
        span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                  ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                    *)in_stack_fffffffffffffdc0,
                   (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffdb8);
        syntax_05._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffdf0;
        syntax_05._M_ptr = (pointer)in_stack_fffffffffffffde8;
        syntax_05._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffdf4;
        Symbol::setAttributes
                  (in_stack_fffffffffffffde0,(Scope *)in_stack_fffffffffffffdd8,syntax_05);
        Scope::addMember(in_stack_fffffffffffffdb0,&in_stack_fffffffffffffda8->super_Symbol);
      }
      else if (SVar1 == ModportSimplePortList) {
        pMVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ModportSimplePortListSyntax>
                           (&this_00->super_SyntaxNode);
        AVar3 = SemanticFacts::getDirection((pMVar4->direction).kind);
        slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::begin
                  ((SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *)0x3e14b8);
        slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::end
                  ((SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *)
                   in_stack_fffffffffffffdb0);
        while (bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>_>
                                 ((self_type *)in_stack_fffffffffffffdb0,
                                  (iterator_base<slang::syntax::ModportPortSyntax_*> *)
                                  in_stack_fffffffffffffda8), ((bVar2 ^ 0xffU) & 1) != 0) {
          this_01 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
                     ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
                                  *)0x3e1512)->super_SyntaxNode;
          if (this_01->kind == ModportExplicitPort) {
            in_stack_fffffffffffffde8 = in_RDI;
            in_stack_fffffffffffffdf4 = AVar3;
            slang::syntax::SyntaxNode::as<slang::syntax::ModportExplicitPortSyntax>(this_01);
            in_stack_fffffffffffffdf8 =
                 ModportPortSymbol::fromSyntax
                           ((ASTContext *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                            (ModportExplicitPortSyntax *)
                            CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
            in_stack_fffffffffffffe00 = (ModportNamedPortSyntax *)&this->super_Scope;
            std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
            span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                      ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                        *)in_stack_fffffffffffffdc0,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                       in_stack_fffffffffffffdb8);
            syntax_02._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffdf0;
            syntax_02._M_ptr = (pointer)in_stack_fffffffffffffde8;
            syntax_02._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffdf4;
            Symbol::setAttributes
                      (in_stack_fffffffffffffde0,(Scope *)in_stack_fffffffffffffdd8,syntax_02);
            Scope::addMember(in_stack_fffffffffffffdb0,&in_stack_fffffffffffffda8->super_Symbol);
          }
          else {
            in_stack_fffffffffffffe08 = in_RDI;
            slang::syntax::SyntaxNode::as<slang::syntax::ModportNamedPortSyntax>(this_01);
            ModportPortSymbol::fromSyntax
                      ((ASTContext *)cVar6.list,cVar7.index._4_4_,
                       (ModportNamedPortSyntax *)cVar7.list);
            std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
            span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                      ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                        *)in_stack_fffffffffffffdc0,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                       in_stack_fffffffffffffdb8);
            syntax_01._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffdf0;
            syntax_01._M_ptr = (pointer)in_stack_fffffffffffffde8;
            syntax_01._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffdf4;
            Symbol::setAttributes
                      (in_stack_fffffffffffffde0,(Scope *)in_stack_fffffffffffffdd8,syntax_01);
            Scope::addMember(in_stack_fffffffffffffdb0,&in_stack_fffffffffffffda8->super_Symbol);
          }
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
                      *)in_stack_fffffffffffffdb0);
        }
      }
      else {
        pMVar5 = slang::syntax::SyntaxNode::as<slang::syntax::ModportSubroutinePortListSyntax>
                           (&this_00->super_SyntaxNode);
        if ((pMVar5->importExport).kind == ExportKeyword) {
          this->hasExports = true;
        }
        slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::begin
                  ((SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *)0x3e1711);
        slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::end
                  ((SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *)
                   in_stack_fffffffffffffdb0);
        while (bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>_>
                                 ((self_type *)in_stack_fffffffffffffdb0,
                                  (iterator_base<slang::syntax::ModportPortSyntax_*> *)
                                  in_stack_fffffffffffffda8), ((bVar2 ^ 0xffU) & 1) != 0) {
          in_stack_fffffffffffffea0 =
               (ASTContext *)
               iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
               ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
                            *)0x3e176b);
          if ((SyntaxNode *)(in_stack_fffffffffffffea0->flags).m_bits != (SyntaxNode *)0x0) {
            Scope::addMembers(in_stack_00000410,in_stack_00000408);
          }
          if (*(SyntaxKind *)&(in_stack_fffffffffffffea0->scope).ptr == ModportNamedPort) {
            in_stack_fffffffffffffdd0 = in_RDI;
            slang::syntax::SyntaxNode::as<slang::syntax::ModportNamedPortSyntax>
                      ((SyntaxNode *)in_stack_fffffffffffffea0);
            in_stack_fffffffffffffdd8 =
                 (Compilation *)
                 MethodPrototypeSymbol::fromSyntax
                           (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                            SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
            in_stack_fffffffffffffde0 = (Symbol *)&this->super_Scope;
            in_stack_fffffffffffffe98 = in_stack_fffffffffffffdd8;
            std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
            span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                      ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                        *)in_stack_fffffffffffffdc0,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                       in_stack_fffffffffffffdb8);
            syntax_03._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffdf0;
            syntax_03._M_ptr = (pointer)in_stack_fffffffffffffde8;
            syntax_03._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffdf4;
            Symbol::setAttributes
                      (in_stack_fffffffffffffde0,(Scope *)in_stack_fffffffffffffdd8,syntax_03);
            Scope::addMember(in_stack_fffffffffffffdb0,&in_stack_fffffffffffffda8->super_Symbol);
          }
          else {
            in_stack_fffffffffffffdb8 =
                 not_null<const_slang::ast::Scope_*>::operator*
                           ((not_null<const_slang::ast::Scope_*> *)0x3e1873);
            slang::syntax::SyntaxNode::as<slang::syntax::ModportSubroutinePortSyntax>
                      ((SyntaxNode *)in_stack_fffffffffffffea0);
            in_stack_fffffffffffffdc0 =
                 MethodPrototypeSymbol::fromSyntax
                           ((Scope *)in_stack_fffffffffffffe98,
                            (ModportSubroutinePortSyntax *)
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (bool)in_stack_fffffffffffffe8f);
            in_stack_fffffffffffffdc8 = (SourceLocation *)&this->super_Scope;
            std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
            span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                      ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                        *)in_stack_fffffffffffffdc0,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                       in_stack_fffffffffffffdb8);
            syntax_04._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffdf0;
            syntax_04._M_ptr = (pointer)in_stack_fffffffffffffde8;
            syntax_04._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffdf4;
            Symbol::setAttributes
                      (in_stack_fffffffffffffde0,(Scope *)in_stack_fffffffffffffdd8,syntax_04);
            Scope::addMember(in_stack_fffffffffffffdb0,&in_stack_fffffffffffffda8->super_Symbol);
          }
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
                      *)in_stack_fffffffffffffdb0);
        }
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
                  *)in_stack_fffffffffffffdb0);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_false>
                *)in_stack_fffffffffffffdb0);
  }
  return;
}

Assistant:

void ModportSymbol::fromSyntax(const ASTContext& context, const ModportDeclarationSyntax& syntax,
                               SmallVectorBase<const ModportSymbol*>& results) {
    auto& comp = context.getCompilation();
    for (auto item : syntax.items) {
        auto modport = comp.emplace<ModportSymbol>(comp, item->name.valueText(),
                                                   item->name.location());
        modport->setSyntax(*item);
        modport->setAttributes(*context.scope, syntax.attributes);
        results.push_back(modport);

        for (auto port : item->ports->ports) {
            switch (port->kind) {
                case SyntaxKind::ModportSimplePortList: {
                    auto& portList = port->as<ModportSimplePortListSyntax>();
                    auto direction = SemanticFacts::getDirection(portList.direction.kind);
                    for (auto simplePort : portList.ports) {
                        switch (simplePort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction, simplePort->as<ModportNamedPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            case SyntaxKind::ModportExplicitPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction,
                                    simplePort->as<ModportExplicitPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            default:
                                SLANG_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportSubroutinePortList: {
                    auto& portList = port->as<ModportSubroutinePortListSyntax>();
                    bool isExport = portList.importExport.kind == TokenKind::ExportKeyword;
                    if (isExport)
                        modport->hasExports = true;

                    for (auto subPort : portList.ports) {
                        if (subPort->previewNode)
                            modport->addMembers(*subPort->previewNode);

                        switch (subPort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    context, subPort->as<ModportNamedPortSyntax>(), isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            case SyntaxKind::ModportSubroutinePort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    *context.scope, subPort->as<ModportSubroutinePortSyntax>(),
                                    isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            default:
                                SLANG_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportClockingPort: {
                    auto& clockingPort = port->as<ModportClockingPortSyntax>();
                    auto& mcs = ModportClockingSymbol::fromSyntax(context, clockingPort);
                    mcs.setAttributes(*modport, clockingPort.attributes);
                    modport->addMember(mcs);
                    break;
                }
                default: {
                    SLANG_UNREACHABLE;
                }
            }
        }
    }
}